

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O1

REF_STATUS ref_matrix_form_m(REF_DBL *d,REF_DBL *m)

{
  *m = d[2] * d[9] * d[9] + *d * d[3] * d[3] + d[1] * d[6] * d[6];
  m[1] = d[9] * d[2] * d[10] + d[3] * *d * d[4] + d[6] * d[1] * d[7];
  m[2] = d[9] * d[2] * d[0xb] + d[3] * *d * d[5] + d[6] * d[1] * d[8];
  m[3] = d[2] * d[10] * d[10] + *d * d[4] * d[4] + d[1] * d[7] * d[7];
  m[4] = d[10] * d[2] * d[0xb] + d[4] * *d * d[5] + d[7] * d[1] * d[8];
  m[5] = d[2] * d[0xb] * d[0xb] + *d * d[5] * d[5] + d[1] * d[8] * d[8];
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_form_m(REF_DBL *d, REF_DBL *m) {
  /* m = d * e * d' */

  /*  d * e
     d[ 3] d[ 6] d[ 9]   d[0]   0    0
     d[ 4] d[ 7] d[10] *   0   d[1]  0
     d[ 5] d[ 8] d[11]     0    0   d[2]
  */

  /* (d*e) * d'
     d[ 3]*d[0]  d[ 6]*d[1]  d[ 9]*d[2]     d[ 3] d[ 4] d[ 5]
     d[ 4]*d[0]  d[ 7]*d[1]  d[10]*d[2]  *  d[ 6] d[ 7] d[ 8]
     d[ 5]*d[0]  d[ 8]*d[1]  d[11]*d[2]     d[ 9] d[10] d[11]
  */

  m[0] = d[3] * d[0] * d[3] + d[6] * d[1] * d[6] + d[9] * d[2] * d[9];
  m[1] = d[3] * d[0] * d[4] + d[6] * d[1] * d[7] + d[9] * d[2] * d[10];
  m[2] = d[3] * d[0] * d[5] + d[6] * d[1] * d[8] + d[9] * d[2] * d[11];
  m[3] = d[4] * d[0] * d[4] + d[7] * d[1] * d[7] + d[10] * d[2] * d[10];
  m[4] = d[4] * d[0] * d[5] + d[7] * d[1] * d[8] + d[10] * d[2] * d[11];
  m[5] = d[5] * d[0] * d[5] + d[8] * d[1] * d[8] + d[11] * d[2] * d[11];

  return REF_SUCCESS;
}